

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O0

_Bool square_isbelievedwall(chunk *c,loc_conflict grid)

{
  _Bool _Var1;
  chunk *c_local;
  loc_conflict grid_local;
  
  _Var1 = square_in_bounds_fully(c,grid);
  if (_Var1) {
    _Var1 = square_isknown(c,grid);
    if (_Var1) {
      _Var1 = square_isprojectable((chunk *)player->cave,grid);
      grid_local.x._3_1_ = (_Bool)((_Var1 ^ 0xffU) & 1);
    }
    else {
      grid_local.x._3_1_ = false;
    }
  }
  else {
    grid_local.x._3_1_ = true;
  }
  return grid_local.x._3_1_;
}

Assistant:

bool square_isbelievedwall(struct chunk *c, struct loc grid)
{
	// the edge of the world is definitely gonna block things
	if (!square_in_bounds_fully(c, grid)) return true;
	// if we dont know assume its projectable
	if (!square_isknown(c, grid)) return false;
	// report what we think (we may be wrong)
	return !square_isprojectable(player->cave, grid);
}